

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpztriangle.cpp
# Opt level: O1

void pztopology::TPZTriangle::ComputeHCurlFaceDirections<Fad<double>>
               (TPZVec<Fad<double>_> *v1,TPZVec<Fad<double>_> *v2,int transformationId)

{
  Fad<double> *pFVar1;
  REAL *pRVar2;
  long lVar3;
  double local_30;
  
  pRVar2 = fTangentVectors[(long)(transformationId * 2) + 1];
  lVar3 = 8;
  do {
    pFVar1 = v1->fStore;
    *(REAL *)((long)pFVar1 + lVar3 + -8) = (*(REAL (*) [2])(pRVar2 + -2))[0];
    if (*(int *)((long)&pFVar1->val_ + lVar3) != 0) {
      local_30 = 0.0;
      Vector<double>::operator=((Vector<double> *)((long)&pFVar1->val_ + lVar3),&local_30);
    }
    pFVar1 = v2->fStore;
    *(REAL *)((long)pFVar1 + lVar3 + -8) = *pRVar2;
    if (*(int *)((long)&pFVar1->val_ + lVar3) != 0) {
      local_30 = 0.0;
      Vector<double>::operator=((Vector<double> *)((long)&pFVar1->val_ + lVar3),&local_30);
    }
    lVar3 = lVar3 + 0x20;
    pRVar2 = pRVar2 + 1;
  } while (lVar3 == 0x28);
  return;
}

Assistant:

void TPZTriangle::ComputeHCurlFaceDirections(TPZVec<TVar> &v1, TPZVec<TVar> &v2, int transformationId)
    {
        for (auto i=0; i< Dimension; i++){
            //v^{F,T} orthonormal vectors associated with face F and tangent to it.
            v1[i] = fTangentVectors[2*transformationId][i];
            v2[i] = fTangentVectors[2*transformationId + 1][i];
        }//for
    }